

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QByteArray,_QByteArray>_>::end(QList<std::pair<QByteArray,_QByteArray>_> *this)

{
  pair<QByteArray,_QByteArray> *n;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QByteArray,_QByteArray>_> *)0x177d69);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }